

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O2

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::EnsureSourceInfo
          (JsBuiltInEngineInterfaceExtensionObject *this)

{
  Recycler *alloc;
  SourceContextInfo *ptr;
  SRCINFO *ptr_00;
  undefined1 auStack_48 [8];
  TrackAllocData data;
  
  if ((this->sourceInfo).ptr != (SRCINFO *)0x0) {
    return;
  }
  auStack_48 = (undefined1  [8])&SourceContextInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_84b2d3a;
  data.filename = (char *)CONCAT44(data.filename._4_4_,0xf1);
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_EngineExtensionObjectBase).scriptContext.ptr)->recycler,
                     (TrackAllocData *)auStack_48);
  ptr = (SourceContextInfo *)new<Memory::Recycler>(0x38,alloc,0x51e21e);
  (ptr->sourceDynamicProfileManager).ptr = (SourceDynamicProfileManager *)0x0;
  ptr->dwHostSourceContext = 0xfffffffffffffffe;
  ptr->isHostDynamicDocument = true;
  ptr->sourceContextId = 0xfffffffe;
  data.plusSize = 0;
  data.count = 0;
  auStack_48 = (undefined1  [8])0x0;
  data.typeinfo = (type_info *)0x0;
  data.filename = (char *)0x0;
  Memory::WriteBarrierPtr<SourceContextInfo>::WriteBarrierSet
            ((WriteBarrierPtr<SourceContextInfo> *)auStack_48,ptr);
  ptr_00 = ScriptContext::AddHostSrcInfo
                     ((this->super_EngineExtensionObjectBase).scriptContext.ptr,
                      (SRCINFO *)auStack_48);
  Memory::WriteBarrierPtr<SRCINFO>::WriteBarrierSet(&this->sourceInfo,ptr_00);
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::EnsureSourceInfo()
    {
        if (sourceInfo == nullptr)
        {
            SourceContextInfo* sourceContextInfo = RecyclerNewStructZ(scriptContext->GetRecycler(), SourceContextInfo);
            sourceContextInfo->dwHostSourceContext = Js::Constants::JsBuiltInSourceContext;
            sourceContextInfo->isHostDynamicDocument = true;
            sourceContextInfo->sourceContextId = Js::Constants::JsBuiltInSourceContextId;

            Assert(sourceContextInfo != nullptr);

            SRCINFO si;
            memset(&si, 0, sizeof(si));
            si.sourceContextInfo = sourceContextInfo;
            sourceInfo = scriptContext->AddHostSrcInfo(&si);
        }
    }